

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O3

void __thiscall DScroller::Serialize(DScroller *this,FArchive *arc)

{
  FArchive *pFVar1;
  BYTE val;
  int val_1;
  undefined1 local_1d;
  EScrollPos local_1c;
  
  DObject::Serialize((DObject *)this,arc);
  local_1d = (undefined1)this->m_Type;
  FArchive::operator<<(arc,&local_1d);
  this->m_Type = (uint)(byte)local_1d;
  pFVar1 = FArchive::operator<<(arc,&this->m_dx);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_dy);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->m_Affectee);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->m_Control);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_LastHeight);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_vdx);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_vdy);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->m_Accel);
  local_1c = this->m_Parts;
  FArchive::operator<<(pFVar1,&local_1c);
  this->m_Parts = local_1c;
  pFVar1 = FArchive::SerializeObject
                     (pFVar1,(DObject **)this->m_Interpolations,
                      DInterpolation::RegistrationInfo.MyClass);
  pFVar1 = FArchive::SerializeObject
                     (pFVar1,(DObject **)(this->m_Interpolations + 1),
                      DInterpolation::RegistrationInfo.MyClass);
  FArchive::SerializeObject
            (pFVar1,(DObject **)(this->m_Interpolations + 2),
             DInterpolation::RegistrationInfo.MyClass);
  return;
}

Assistant:

void DScroller::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << m_Type
		<< m_dx << m_dy
		<< m_Affectee
		<< m_Control
		<< m_LastHeight
		<< m_vdx << m_vdy
		<< m_Accel
		<< m_Parts
		<< m_Interpolations[0]
		<< m_Interpolations[1]
		<< m_Interpolations[2];
}